

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O1

void __thiscall
miner_tests::MinerTestingSetup::TestBasicMining
          (MinerTestingSetup *this,CScript *scriptPubKey,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txFirst,int baseheight)

{
  int *piVar1;
  FastRandomContext *this_00;
  element_type *peVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  base_blob<256U> *pbVar9;
  pointer pCVar10;
  pointer pCVar11;
  readonly_property<bool> rVar12;
  bool bVar13;
  uint uVar14;
  CTxMemPool *pCVar15;
  time_point tVar16;
  pointer __s;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar17;
  Chainstate *pCVar18;
  CBlockIndex *pCVar19;
  uint256 *puVar20;
  CCoinsViewCache *pCVar21;
  CBlockIndex **ppCVar22;
  int64_t iVar23;
  int64_t iVar24;
  CBlockIndex *pCVar25;
  long lVar26;
  uint uVar27;
  iterator __first;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar28;
  CScript *pCVar29;
  _Head_base<0UL,_node::CBlockTemplate_*,_false> _Var30;
  iterator in_R8;
  iterator pvVar31;
  char *pcVar32;
  char *pcVar33;
  iterator in_R9;
  iterator pvVar34;
  int iVar35;
  value_type *__val;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  Span<std::byte> output;
  const_string file_11;
  Span<std::byte> output_00;
  const_string file_12;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  TestMemPoolEntryHelper entry;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  vector<int,_std::allocator<int>_> prevheights;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  Txid hash;
  CScript script;
  check_type cVar36;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  undefined4 local_9f4;
  _Rb_tree_node_base local_9f0;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 local_998 [96];
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  CChainParams *local_918;
  char *local_910;
  Chainstate *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 local_600 [88];
  char *local_5a8;
  char *local_5a0;
  __node_base_ptr local_598;
  undefined1 *local_590;
  char *local_588;
  CChainParams *local_580;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 local_518 [88];
  char *local_4c0;
  char *local_4b8;
  __node_base_ptr local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  CChainParams *local_498;
  undefined1 local_490 [152];
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 local_3d8 [88];
  char *local_380;
  char *local_378;
  __node_base_ptr local_370;
  undefined1 *local_368;
  char *local_360;
  CChainParams *local_358;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 local_2f0 [96];
  size_t sStack_290;
  undefined4 local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined8 local_274;
  CTxMemPool *local_268;
  Chainstate *pCStack_260;
  CMutableTransaction local_250;
  undefined4 *local_218;
  _Rb_tree_node_base *local_210;
  unique_lock<std::recursive_mutex> local_208;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [28];
  size_type sStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  undefined1 auStack_170 [40];
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_148 [4];
  _Head_base<0UL,_node::CBlockTemplate_*,_false> local_78;
  _Base_ptr p_Stack_70;
  pointer local_68;
  CTxMemPool *pCStack_60;
  undefined1 local_58 [16];
  shared_count sStack_48;
  undefined8 local_40;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_68 = (pointer)0x0;
  pCStack_60 = (CTxMemPool *)0x0;
  local_78._M_head_impl = (CBlockTemplate *)0x0;
  p_Stack_70 = (_Base_ptr)0x0;
  CMutableTransaction::CMutableTransaction(&local_250);
  sStack_290 = 0;
  local_280._0_4_ = 0;
  local_280._4_4_ = 0;
  local_278 = 0;
  local_274 = 4;
  local_268 = (CTxMemPool *)0x0;
  pCStack_260 = (Chainstate *)0x0;
  local_2f0._88_8_ = 0xb;
  local_288 = 0xb;
  pCVar15 = MakeMempool(this);
  local_1f8._0_8_ = &pCVar15->cs;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1f8);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1d8,(CScript *)local_188);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
      local_188._0_8_ !=
      (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_2f0._72_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2f0._80_8_ = "";
  local_2f0._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xea;
  file.m_begin = local_2f0 + 0x48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_2f0 + 0x38),
             msg);
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  auStack_170._0_8_ = local_1a8;
  local_1a8._0_8_ = "pblocktemplate";
  local_1a8._8_4_ = 2.150269e-38;
  local_1a8._12_4_ = 0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013abc70;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_2f0._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2f0._48_8_ = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  local_58[0] = (_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                 )local_1d8._0_8_ != (CBlockTemplate *)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_188,1,0,WARN,_cVar36,
             (size_t)(local_2f0 + 0x28),0xea);
  boost::detail::shared_count::~shared_count(&sStack_48);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_250.vin,1);
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = (class_property<bool>)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = (class_property<bool>)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)&(_Var30._M_head_impl)->block + (long)(int)uVar14),local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = (class_property<bool>)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)&(_Var30._M_head_impl)->block + (long)(int)uVar14),local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = (class_property<bool>)0x61;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)&(_Var30._M_head_impl)->block + (long)(int)uVar14),local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = (class_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)&(_Var30._M_head_impl)->block + (long)(int)uVar14),local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)&(_Var30._M_head_impl)->block + (long)(int)uVar14),local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
  }
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_250.vout,1);
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  iVar35 = 0x3e9;
  do {
    (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue =
         (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_188,&local_250);
    local_68 = (pointer)local_178;
    pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
    local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
    p_Stack_70 = (_Base_ptr)local_188._8_8_;
    local_2f0._88_8_ = 1000000;
    tVar16 = NodeClock::now();
    sStack_290 = (long)tVar16.__d.__r / 1000000000;
    local_278 = iVar35 == 0x3e9;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250)
    ;
    CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_148);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
    }
    *(pointer *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x10) = local_68;
    *(CTxMemPool **)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x18) = pCStack_60;
    *(CBlockTemplate **)
     ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
     _M_elems = local_78._M_head_impl;
    *(_Base_ptr *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 8) = p_Stack_70;
    iVar35 = iVar35 + -1;
  } while (iVar35 != 0);
  local_2f0._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2f0._32_8_ = "";
  local_2f0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xfd;
  file_00.m_begin = local_2f0 + 0x18;
  msg_00.m_end = pvVar34;
  msg_00.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)(local_2f0 + 8),
             msg_00);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_2f0,(CScript *)local_188);
  if ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)local_2f0._0_8_ !=
      (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_2f0,(CBlockTemplate *)local_2f0._0_8_);
  }
  local_2f0._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfd;
  file_01.m_begin = (iterator)&local_300;
  msg_01.m_end = pvVar34;
  msg_01.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_310,
             msg_01);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ac470;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  auStack_170._0_8_ = "exception std::runtime_error expected but not raised";
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_318 = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_188,1,1,WARN,_cVar36,
             (size_t)&local_320,0xfd);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((CBlockTemplate *)local_1d8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1d8,(CBlockTemplate *)local_1d8._0_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1f8);
  pCVar15 = MakeMempool(this);
  local_1c8._0_8_ = &pCVar15->cs;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1c8);
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  iVar35 = 0x3e9;
  do {
    (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue =
         (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_188,&local_250);
    local_68 = (pointer)local_178;
    pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
    local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
    p_Stack_70 = (_Base_ptr)local_188._8_8_;
    local_2f0._88_8_ = 1000000;
    tVar16 = NodeClock::now();
    sStack_290 = (long)tVar16.__d.__r / 1000000000;
    local_278 = iVar35 == 0x3e9;
    local_274._0_4_ = 0x50;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250)
    ;
    CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_148);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
    }
    *(pointer *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x10) = local_68;
    *(CTxMemPool **)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x18) = pCStack_60;
    *(CBlockTemplate **)
     ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
     _M_elems = local_78._M_head_impl;
    *(_Base_ptr *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 8) = p_Stack_70;
    iVar35 = iVar35 + -1;
  } while (iVar35 != 0);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_358 = (CChainParams *)0xea225f;
  local_370 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x10e;
  file_02.m_begin = (iterator)&local_360;
  msg_02.m_end = pvVar34;
  msg_02.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_370,
             msg_02);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1d8,(CScript *)local_188);
  local_1a8[0] = (CBlockTemplate *)local_1d8._0_8_ != (CBlockTemplate *)0x0;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_1f8._0_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x11;
  local_1f8._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_1f8;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_378 = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
             (size_t)&local_380,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
      local_1d8._0_8_ !=
      (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1d8,(CBlockTemplate *)local_1d8._0_8_);
  }
  local_1d8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
      local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1c8);
  pCVar15 = MakeMempool(this);
  local_1c8._0_8_ = &pCVar15->cs;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1c8);
  pCVar10 = local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar29 = &(local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig;
  if (0x1c < ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size) {
    free((pCVar29->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(undefined8 *)((long)&(pCVar10->scriptSig).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(pCVar10->scriptSig).super_CScriptBase._union + 0x18) = 0;
  (pCVar29->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar10->scriptSig).super_CScriptBase._union + 8) = 0;
  __s = (pointer)operator_new(0x208);
  memset(__s,0,0x208);
  iVar35 = 0x12;
  do {
    b._M_extent._M_extent_value = 0x208;
    b._M_ptr = __s;
    ppVar17 = &CScript::operator<<(&(local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->scriptSig,b)->
               super_CScriptBase;
    uVar14 = ppVar17->_size;
    uVar27 = uVar14 - 0x1d;
    if (uVar14 < 0x1d) {
      uVar27 = uVar14;
    }
    ppVar28 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar17->_union).indirect_contents.indirect;
    if (uVar14 < 0x1d) {
      ppVar28 = ppVar17;
    }
    local_188[0] = 0x75;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar17,(uchar *)((long)&ppVar28->_union + (long)(int)uVar27),local_188);
    iVar35 = iVar35 + -1;
  } while (iVar35 != 0);
  uVar14 = ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size;
  uVar27 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar27 = uVar14;
  }
  pCVar29 = (CScript *)
            ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
            indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    pCVar29 = &(local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig;
  }
  local_188[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (uchar *)((long)&(pCVar29->super_CScriptBase)._union + (long)(int)uVar27),local_188);
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  iVar35 = 0x80;
  do {
    (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue =
         (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_188,&local_250);
    local_68 = (pointer)local_178;
    pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
    local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
    p_Stack_70 = (_Base_ptr)local_188._8_8_;
    local_2f0._88_8_ = 1000000;
    tVar16 = NodeClock::now();
    sStack_290 = (long)tVar16.__d.__r / 1000000000;
    local_278 = iVar35 == 0x80;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250)
    ;
    CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_148);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
    }
    *(pointer *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x10) = local_68;
    *(CTxMemPool **)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x18) = pCStack_60;
    *(CBlockTemplate **)
     ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
     _M_elems = local_78._M_head_impl;
    *(_Base_ptr *)
     (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 8) = p_Stack_70;
    iVar35 = iVar35 + -1;
  } while (iVar35 != 0);
  local_3d8._72_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3d8._80_8_ = "";
  local_3d8._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x126;
  file_03.m_begin = local_3d8 + 0x48;
  msg_03.m_end = pvVar34;
  msg_03.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
             (size_t)(local_3d8 + 0x38),msg_03);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1d8,(CScript *)local_188);
  local_1a8[0] = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_1d8._0_8_ !=
                 (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_1f8._0_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x11;
  local_1f8._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_1f8;
  local_3d8._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3d8._48_8_ = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
             (size_t)(local_3d8 + 0x28),0x126);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  if ((CBlockTemplate *)local_1d8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1d8,(CBlockTemplate *)local_1d8._0_8_);
  }
  local_1d8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  operator_delete(__s,0x208);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1c8);
  pCVar15 = MakeMempool(this);
  local_1f8._0_8_ = &pCVar15->cs;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1f8);
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 1000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_3d8._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3d8._32_8_ = "";
  local_3d8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x130;
  file_04.m_begin = local_3d8 + 0x18;
  msg_04.m_end = pvVar34;
  msg_04.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)(local_3d8 + 8),
             msg_04);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_3d8,(CScript *)local_188);
  if ((CBlockTemplate *)local_3d8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_3d8,(CBlockTemplate *)local_3d8._0_8_);
  }
  local_3d8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x130;
  file_05.m_begin = (iterator)&local_3e8;
  msg_05.m_end = pvVar34;
  msg_05.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
             msg_05);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ac470;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  auStack_170._0_8_ = "exception std::runtime_error expected but not raised";
  local_490._136_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_490._144_8_ = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_188,1,1,WARN,_cVar36,
             (size_t)(local_490 + 0x88),0x130);
  boost::detail::shared_count::~shared_count(&sStack_48);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1f8);
  pCVar15 = MakeMempool(this);
  local_1c8._0_8_ = &pCVar15->cs;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1c8);
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = (readonly_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 4900000000;
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 100000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  *(pointer *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_68;
  *(CTxMemPool **)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = pCStack_60;
  *(CBlockTemplate **)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       local_78._M_head_impl;
  *(_Base_ptr *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = p_Stack_70;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_250.vin,2);
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = (readonly_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 0x10);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)&(peVar2->hash).m_wrapped;
  *(undefined8 *)
   (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
  *(undefined8 *)
   (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) = uVar7;
  *(undefined8 *)
   (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start[1].prevout.n = 0;
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue =
       (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start)->nValue + 4600000000;
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 400000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_490._72_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_490._80_8_ = "";
  local_490._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_490._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x145;
  file_06.m_begin = local_490 + 0x48;
  msg_06.m_end = pvVar34;
  msg_06.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
             (size_t)(local_490 + 0x38),msg_06);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1d8,(CScript *)local_188);
  local_1a8[0] = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_1d8._0_8_ !=
                 (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_1f8._0_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x11;
  local_1f8._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_490._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_490._48_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
       + 100;
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  local_40 = (_Base_ptr)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
             (size_t)(local_490 + 0x28),0x145);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  if ((CBlockTemplate *)local_1d8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1d8,(CBlockTemplate *)local_1d8._0_8_);
  }
  local_1d8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1c8);
  pCVar15 = MakeMempool(this);
  local_1f8._0_8_ = &pCVar15->cs;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_250.vin,1);
  pbVar9 = &((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x10] = '\0';
  (pbVar9->m_data)._M_elems[0x11] = '\0';
  (pbVar9->m_data)._M_elems[0x12] = '\0';
  (pbVar9->m_data)._M_elems[0x13] = '\0';
  (pbVar9->m_data)._M_elems[0x14] = '\0';
  (pbVar9->m_data)._M_elems[0x15] = '\0';
  (pbVar9->m_data)._M_elems[0x16] = '\0';
  (pbVar9->m_data)._M_elems[0x17] = '\0';
  pbVar9 = &((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  (pbVar9->m_data)._M_elems[0x1c] = '\0';
  (pbVar9->m_data)._M_elems[0x1d] = '\0';
  (pbVar9->m_data)._M_elems[0x1e] = '\0';
  (pbVar9->m_data)._M_elems[0x1f] = '\0';
  puVar20 = &((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped;
  (puVar20->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar20->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar9 = &((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[8] = '\0';
  (pbVar9->m_data)._M_elems[9] = '\0';
  (pbVar9->m_data)._M_elems[10] = '\0';
  (pbVar9->m_data)._M_elems[0xb] = '\0';
  (pbVar9->m_data)._M_elems[0xc] = '\0';
  (pbVar9->m_data)._M_elems[0xd] = '\0';
  (pbVar9->m_data)._M_elems[0xe] = '\0';
  (pbVar9->m_data)._M_elems[0xf] = '\0';
  ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0xffffffff;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  _Var30._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  uVar14 = auStack_170._4_4_ - 0x1d;
  if ((uint)auStack_170._4_4_ < 0x1d) {
    _Var30._M_head_impl = (CBlockTemplate *)local_188;
    uVar14 = auStack_170._4_4_;
  }
  local_58[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,
             (uchar *)((long)_Var30._M_head_impl + (long)(int)uVar14),local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ = (CBlockTemplate *)0x0;
  }
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0;
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 1000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 0;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_490._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_490._32_8_ = "";
  local_490._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_490._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x155;
  file_07.m_begin = local_490 + 0x18;
  msg_07.m_end = pvVar34;
  msg_07.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)(local_490 + 8),
             msg_07);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_490,(CScript *)local_188);
  if ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)local_490._0_8_ !=
      (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_490,(CBlockTemplate *)local_490._0_8_);
  }
  local_490._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_498 = (CChainParams *)0xea225f;
  local_4b0 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x155;
  file_08.m_begin = (iterator)&local_4a0;
  msg_08.m_end = pvVar34;
  msg_08.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4b0,
             msg_08);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ac470;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  auStack_170._0_8_ = "exception std::runtime_error expected but not raised";
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_4b8 = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_188,1,1,WARN,_cVar36,
             (size_t)&local_4c0,0x155);
  boost::detail::shared_count::~shared_count(&sStack_48);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1f8);
  pCVar15 = MakeMempool(this);
  local_1f8._0_8_ = &pCVar15->cs;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1f8);
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = 0;
  local_58[0] = (readonly_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
  }
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 4900000000;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = (readonly_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             ((long)local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 8),
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 100000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58[0] = 0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             ((long)local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 8),
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 100000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_518._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_518._32_8_ = "";
  local_518._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_518._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x166;
  file_09.m_begin = local_518 + 0x18;
  msg_09.m_end = pvVar34;
  msg_09.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)(local_518 + 8),
             msg_09);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_518,(CScript *)local_188);
  if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
      local_518._0_8_ !=
      (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_518,(CBlockTemplate *)local_518._0_8_);
  }
  local_518._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x166;
  file_10.m_begin = (iterator)&local_528;
  msg_10.m_end = pvVar34;
  msg_10.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_538,
             msg_10);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ac470;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  auStack_170._0_8_ = "exception std::runtime_error expected but not raised";
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_540 = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_188,1,1,WARN,_cVar36,
             (size_t)&local_548,0x166);
  boost::detail::shared_count::~shared_count(&sStack_48);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_1f8);
  pCVar15 = MakeMempool(this);
  local_1d8._0_8_ = &pCVar15->cs;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1d8);
  pCVar18 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar3 = (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar4 = (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  while (pCVar18 = ChainstateManager::ActiveChainstate
                             ((this->super_TestingSetup).super_ChainTestingSetup.
                              super_BasicTestingSetup.m_node.chainman._M_t.
                              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                              .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl),
        (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight < 209999) {
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar18->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 ==
        (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar25 = (CBlockIndex *)0x0;
    }
    else {
      pCVar25 = ppCVar5[-1];
    }
    pCVar19 = (CBlockIndex *)operator_new(0x98);
    memset(pCVar19,0,0x98);
    puVar20 = (uint256 *)operator_new(0x20);
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[0x10] = '\0';
    (pbVar9->m_data)._M_elems[0x11] = '\0';
    (pbVar9->m_data)._M_elems[0x12] = '\0';
    (pbVar9->m_data)._M_elems[0x13] = '\0';
    (pbVar9->m_data)._M_elems[0x14] = '\0';
    (pbVar9->m_data)._M_elems[0x15] = '\0';
    (pbVar9->m_data)._M_elems[0x16] = '\0';
    (pbVar9->m_data)._M_elems[0x17] = '\0';
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[0x18] = '\0';
    (pbVar9->m_data)._M_elems[0x19] = '\0';
    (pbVar9->m_data)._M_elems[0x1a] = '\0';
    (pbVar9->m_data)._M_elems[0x1b] = '\0';
    (pbVar9->m_data)._M_elems[0x1c] = '\0';
    (pbVar9->m_data)._M_elems[0x1d] = '\0';
    (pbVar9->m_data)._M_elems[0x1e] = '\0';
    (pbVar9->m_data)._M_elems[0x1f] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[8] = '\0';
    (pbVar9->m_data)._M_elems[9] = '\0';
    (pbVar9->m_data)._M_elems[10] = '\0';
    (pbVar9->m_data)._M_elems[0xb] = '\0';
    (pbVar9->m_data)._M_elems[0xc] = '\0';
    (pbVar9->m_data)._M_elems[0xd] = '\0';
    (pbVar9->m_data)._M_elems[0xe] = '\0';
    (pbVar9->m_data)._M_elems[0xf] = '\0';
    output.m_size = 0x20;
    output.m_data = (byte *)puVar20;
    FastRandomContext::fillrand(this_00,output);
    pCVar19->phashBlock = puVar20;
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar21 = Chainstate::CoinsTip(pCVar18);
    puVar20 = pCVar19->phashBlock;
    if (puVar20 == (uint256 *)0x0) goto LAB_004536e8;
    local_188._0_8_ = *(undefined8 *)(puVar20->super_base_blob<256U>).m_data._M_elems;
    local_188._8_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 8);
    local_178 = *(undefined1 (*) [8])((puVar20->super_base_blob<256U>).m_data._M_elems + 0x10);
    auStack_170._0_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 0x18);
    CCoinsViewCache::SetBestBlock(pCVar21,(uint256 *)local_188);
    pCVar19->pprev = pCVar25;
    pCVar19->nHeight = pCVar25->nHeight + 1;
    CBlockIndex::BuildSkip(pCVar19);
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    CChain::SetTip(&pCVar18->m_chain,pCVar19);
  }
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_580 = (CChainParams *)0xea225f;
  local_598 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x17a;
  file_11.m_begin = (iterator)&local_588;
  msg_11.m_end = pvVar34;
  msg_11.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_598,
             msg_11);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1f8,(CScript *)local_188);
  local_1a8[0] = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_1f8._0_8_ !=
                 (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_1c8._0_8_ = "AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)";
  local_1c8._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_1c8;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_5a0 = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
             (size_t)&local_5a8,0x17a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  if ((CBlockTemplate *)local_1f8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1f8,(CBlockTemplate *)local_1f8._0_8_);
  }
  local_1f8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
      local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  while( true ) {
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    if (209999 < (pCVar18->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->nHeight) break;
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar18->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 ==
        (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar25 = (CBlockIndex *)0x0;
    }
    else {
      pCVar25 = ppCVar5[-1];
    }
    pCVar19 = (CBlockIndex *)operator_new(0x98);
    memset(pCVar19,0,0x98);
    puVar20 = (uint256 *)operator_new(0x20);
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[0x10] = '\0';
    (pbVar9->m_data)._M_elems[0x11] = '\0';
    (pbVar9->m_data)._M_elems[0x12] = '\0';
    (pbVar9->m_data)._M_elems[0x13] = '\0';
    (pbVar9->m_data)._M_elems[0x14] = '\0';
    (pbVar9->m_data)._M_elems[0x15] = '\0';
    (pbVar9->m_data)._M_elems[0x16] = '\0';
    (pbVar9->m_data)._M_elems[0x17] = '\0';
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[0x18] = '\0';
    (pbVar9->m_data)._M_elems[0x19] = '\0';
    (pbVar9->m_data)._M_elems[0x1a] = '\0';
    (pbVar9->m_data)._M_elems[0x1b] = '\0';
    (pbVar9->m_data)._M_elems[0x1c] = '\0';
    (pbVar9->m_data)._M_elems[0x1d] = '\0';
    (pbVar9->m_data)._M_elems[0x1e] = '\0';
    (pbVar9->m_data)._M_elems[0x1f] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar20->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar9 = &puVar20->super_base_blob<256U>;
    (pbVar9->m_data)._M_elems[8] = '\0';
    (pbVar9->m_data)._M_elems[9] = '\0';
    (pbVar9->m_data)._M_elems[10] = '\0';
    (pbVar9->m_data)._M_elems[0xb] = '\0';
    (pbVar9->m_data)._M_elems[0xc] = '\0';
    (pbVar9->m_data)._M_elems[0xd] = '\0';
    (pbVar9->m_data)._M_elems[0xe] = '\0';
    (pbVar9->m_data)._M_elems[0xf] = '\0';
    output_00.m_size = 0x20;
    output_00.m_data = (byte *)puVar20;
    FastRandomContext::fillrand(this_00,output_00);
    pCVar19->phashBlock = puVar20;
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar21 = Chainstate::CoinsTip(pCVar18);
    puVar20 = pCVar19->phashBlock;
    if (puVar20 == (uint256 *)0x0) goto LAB_004536e8;
    local_188._0_8_ = *(undefined8 *)(puVar20->super_base_blob<256U>).m_data._M_elems;
    local_188._8_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 8);
    local_178 = *(undefined1 (*) [8])((puVar20->super_base_blob<256U>).m_data._M_elems + 0x10);
    auStack_170._0_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 0x18);
    CCoinsViewCache::SetBestBlock(pCVar21,(uint256 *)local_188);
    pCVar19->pprev = pCVar25;
    pCVar19->nHeight = pCVar25->nHeight + 1;
    CBlockIndex::BuildSkip(pCVar19);
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    CChain::SetTip(&pCVar18->m_chain,pCVar19);
  }
  local_600._72_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_600._80_8_ = "";
  local_600._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_600._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x186;
  file_12.m_begin = local_600 + 0x48;
  msg_12.m_end = pvVar34;
  msg_12.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
             (size_t)(local_600 + 0x38),msg_12);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1f8,(CScript *)local_188);
  local_1a8[0] = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_1f8._0_8_ !=
                 (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_1c8._0_8_ = "AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)";
  local_1c8._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_1c8;
  local_600._40_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_600._48_8_ = "";
  pvVar31 = (iterator)0x1;
  pvVar34 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
             (size_t)(local_600 + 0x28),0x186);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  if ((CBlockTemplate *)local_1f8._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1f8,(CBlockTemplate *)local_1f8._0_8_);
  }
  local_1f8._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
      local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar7;
  ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = 0;
  local_58[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
  }
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0x129f6afc0;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = 0;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
             local_1a8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  ScriptHash::ScriptHash((ScriptHash *)local_1c8,(CScript *)local_58);
  local_178._0_4_ = local_1c8._16_4_;
  local_188._0_8_ = local_1c8._0_8_;
  local_188._8_8_ = local_1c8._8_8_;
  local_148[0]._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = '\x03';
  GetScriptForDestination((CScript *)local_1a8,(CTxDestination *)local_188);
  pCVar11 = local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar29 = (CScript *)
            ((long)local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start + 8);
  if (0x1c < *(size_type *)
              ((long)local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x24)) {
    free((pCVar29->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)pCVar11 + 0x14) = CONCAT44(local_1a8._16_4_,local_1a8._12_4_);
  *(ulong *)((long)pCVar11 + 0x1c) = CONCAT44(local_1a8._24_4_,local_1a8._20_4_);
  (pCVar29->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_1a8._0_8_;
  *(long *)((long)pCVar11 + 0x10) = CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
  *(size_type *)((long)pCVar11 + 0x24) = sStack_18c;
  sStack_18c = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_188);
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 1000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  *(pointer *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_68;
  *(CTxMemPool **)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = pCStack_60;
  *(CBlockTemplate **)
   ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       local_78._M_head_impl;
  *(_Base_ptr *)
   (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = p_Stack_70;
  local_178 = (undefined1  [8])0x0;
  auStack_170._0_8_ = (CTxMemPool *)0x0;
  local_188._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __first.ptr = (uchar *)local_58;
  uVar14 = local_40._4_4_;
  if (0x1c < local_40._4_4_) {
    __first.ptr = (uchar *)local_58._0_8_;
    uVar14 = local_40._4_4_ - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,__first,
             (iterator)(__first.ptr + (int)uVar14),(allocator_type *)local_1c8);
  b_00._M_extent._M_extent_value = CONCAT44(local_1a8._12_4_,local_1a8._8_4_) - local_1a8._0_8_;
  b_00._M_ptr = (pointer)local_1a8._0_8_;
  ppVar17 = &CScript::operator<<((CScript *)local_188,b_00)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar17);
  if ((_Hash_node_base *)local_1a8._0_8_ != (_Hash_node_base *)0x0) {
    operator_delete((void *)local_1a8._0_8_,
                    CONCAT44(local_1a8._20_4_,local_1a8._16_4_) - local_1a8._0_8_);
  }
  if (0x1c < (uint)auStack_170._4_4_) {
    free((void *)local_188._0_8_);
    local_188._0_8_ =
         (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue =
       (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start)->nValue + -1000000;
  CMutableTransaction::GetHash((Txid *)local_188,&local_250);
  local_68 = (pointer)local_178;
  pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
  local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
  p_Stack_70 = (_Base_ptr)local_188._8_8_;
  local_2f0._88_8_ = 1000000;
  tVar16 = NodeClock::now();
  sStack_290 = (long)tVar16.__d.__r / 1000000000;
  local_278 = 0;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),&local_250);
  CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  local_600._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_600._32_8_ = "";
  local_600._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_600._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x197;
  file_13.m_begin = local_600 + 0x18;
  msg_13.m_end = pvVar34;
  msg_13.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)(local_600 + 8),
             msg_13);
  AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_600,(CScript *)local_188);
  if ((CBlockTemplate *)local_600._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_600,(CBlockTemplate *)local_600._0_8_);
  }
  local_600._0_8_ = (CBlockTemplate *)0x0;
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(auStack_170 + 0x10));
  if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_188,(CBlockTemplate *)local_188._0_8_);
  }
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x197;
  file_14.m_begin = (iterator)&local_610;
  msg_14.m_end = pvVar34;
  msg_14.m_begin = pvVar31;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_620,
             msg_14);
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_4_ = 0.0;
  local_1a8._12_4_ = 0;
  local_1a8._16_4_ = 0;
  local_1a8._20_4_ = 0;
  local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
  local_188._0_8_ = &PTR__lazy_ostream_013ac470;
  local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  auStack_170._0_8_ = "exception std::runtime_error expected but not raised";
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_628 = "";
  pcVar32 = (char *)0x1;
  pvVar31 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,1,WARN,_cVar36,
             (size_t)&local_630,0x197);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
  while( true ) {
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    if ((pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight <
        (int)((ulong)((long)ppCVar3 - (long)ppCVar4) >> 3)) {
      if (0x1c < local_40._4_4_) {
        free((void *)local_58._0_8_);
        local_58._0_8_ = (_func_int **)0x0;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_1d8);
      pCVar15 = MakeMempool(this);
      local_208._M_device = &(pCVar15->cs).super_recursive_mutex;
      local_208._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_208);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      SetMockTime(iVar23 + 1);
      local_1f8._0_8_ =
           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = (pointer)0x0;
      local_250.version = 2;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_250.vin,1);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_1f8,1);
      peVar2 = (((txFirst->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
      uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
      uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar8;
      *(undefined8 *)
       ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = uVar6;
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar7;
      ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).n = 0;
      local_178 = (undefined1  [8])0x0;
      auStack_170._0_8_ = (CTxMemPool *)0x0;
      local_188._0_8_ =
           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      local_188._8_8_ = 0;
      local_58[0] = (readonly_property<bool>)0x51;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
                 local_58);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
      if (0x1c < (uint)auStack_170._4_4_) {
        free((void *)local_188._0_8_);
        local_188._0_8_ =
             (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      }
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence =
           (pCVar18->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nHeight + 1;
      *(int *)local_1f8._0_8_ = baseheight + 1;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_250.vout,1);
      (local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start)->nValue = 4900000000;
      local_178 = (undefined1  [8])0x0;
      auStack_170._0_8_ = (CTxMemPool *)0x0;
      local_188._0_8_ =
           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      local_188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58[0] = (readonly_property<bool>)0x51;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188,(iterator)local_188,
                 local_58);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)local_250.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start + 8),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_188);
      if (0x1c < (uint)auStack_170._4_4_) {
        free((void *)local_188._0_8_);
        local_188._0_8_ =
             (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
      }
      local_250.nLockTime = 0;
      CMutableTransaction::GetHash((Txid *)local_188,&local_250);
      local_68 = (pointer)local_178;
      pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
      local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
      p_Stack_70 = (_Base_ptr)local_188._8_8_;
      local_2f0._88_8_ = 100000000;
      tVar16 = NodeClock::now();
      sStack_290 = (long)tVar16.__d.__r / 1000000000;
      local_278 = 1;
      TestMemPoolEntryHelper::FromTx
                ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),
                 &local_250);
      CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree(local_148);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                   *)local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      local_670 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_668 = "";
      local_680 = &boost::unit_test::basic_cstring<char_const>::null;
      local_678 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x1bb;
      file_15.m_begin = (iterator)&local_670;
      msg_15.m_end = pvVar31;
      msg_15.m_begin = pcVar32;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_680,
                 msg_15);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1d8._0_8_ = (CBlockTemplate *)0x0;
      }
      else {
        local_1d8._0_8_ =
             ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
             (ppCVar3 + -1))->
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
        ;
      }
      ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                           ((CBlockIndex **)local_1d8,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                            ,0x1bb,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
      pCVar25 = *ppCVar22;
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      rVar12.super_class_property<bool>.value =
           (class_property<bool>)CheckFinalTxAtTip(pCVar25,(CTransaction *)local_188);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "CheckFinalTxAtTip(*inline_assertion_check<true>(m_node.chainman->ActiveChain().Tip(), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp\", 443, __func__, \"m_node.chainman->ActiveChain().Tip()\"), CTransaction{tx})"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_690 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_688 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      local_1a8[0] = rVar12.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_690,0x1bb);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_6a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_698 = "";
      local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_16.m_end = (iterator)0x1bc;
      file_16.m_begin = (iterator)&local_6a0;
      msg_16.m_end = pvVar34;
      msg_16.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_6b0,
                 msg_16);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8[0] = !bVar13;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "!TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_6c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_6b8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_6c0,0x1bc);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pCVar25 = (CBlockIndex *)0x0;
      }
      else {
        pCVar25 = ppCVar3[-1];
      }
      local_6d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_6c8 = "";
      local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_17.m_end = (iterator)0x1c0;
      file_17.m_begin = (iterator)&local_6d0;
      msg_17.m_end = pvVar34;
      msg_17.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_6e0,
                 msg_17);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      iVar35 = pCVar25->nHeight;
      pCVar19 = (CBlockIndex *)operator_new(0x98);
      memset(pCVar19,0,0x98);
      pCVar19->nHeight = iVar35 + 2;
      pCVar19->pprev = pCVar25;
      local_1a8[0] = SequenceLocks((CTransaction *)local_188,1,
                                   (vector<int,_std::allocator<int>_> *)local_1f8,pCVar19);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 2, active_chain_tip))"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_6f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_6e8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_6f0,0x1c0);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      operator_delete(pCVar19,0x98);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      peVar2 = (txFirst->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
      uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
      uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar8;
      *(undefined8 *)
       ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = uVar6;
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar7;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar24 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start[1]);
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence =
           (int)((ulong)((iVar23 + 1) - iVar24) >> 9) + 1U | 0x400000;
      *(int *)local_1f8._0_8_ = baseheight + 2;
      CMutableTransaction::GetHash((Txid *)local_188,&local_250);
      local_68 = (pointer)local_178;
      pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
      local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
      p_Stack_70 = (_Base_ptr)local_188._8_8_;
      tVar16 = NodeClock::now();
      sStack_290 = (long)tVar16.__d.__r / 1000000000;
      TestMemPoolEntryHelper::FromTx
                ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),
                 &local_250);
      CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree(local_148);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                   *)local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      local_700 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_6f8 = "";
      local_710 = &boost::unit_test::basic_cstring<char_const>::null;
      local_708 = &boost::unit_test::basic_cstring<char_const>::null;
      file_18.m_end = (iterator)0x1c9;
      file_18.m_begin = (iterator)&local_700;
      msg_18.m_end = pvVar34;
      msg_18.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_710,
                 msg_18);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1d8._0_8_ = (CBlockTemplate *)0x0;
      }
      else {
        local_1d8._0_8_ =
             ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
             (ppCVar3 + -1))->
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
        ;
      }
      ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                           ((CBlockIndex **)local_1d8,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                            ,0x1c9,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
      pCVar25 = *ppCVar22;
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      rVar12.super_class_property<bool>.value =
           (class_property<bool>)CheckFinalTxAtTip(pCVar25,(CTransaction *)local_188);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "CheckFinalTxAtTip(*inline_assertion_check<true>(m_node.chainman->ActiveChain().Tip(), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp\", 457, __func__, \"m_node.chainman->ActiveChain().Tip()\"), CTransaction{tx})"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_720 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_718 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      local_1a8[0] = rVar12.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_720,0x1c9);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_730 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_728 = "";
      local_740 = &boost::unit_test::basic_cstring<char_const>::null;
      local_738 = &boost::unit_test::basic_cstring<char_const>::null;
      file_19.m_end = (iterator)0x1ca;
      file_19.m_begin = (iterator)&local_730;
      msg_19.m_end = pvVar34;
      msg_19.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_740,
                 msg_19);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8[0] = !bVar13;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "!TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_750 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_748 = "";
      iVar35 = 0;
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_750,0x1ca);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      do {
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        ppCVar3 = (pCVar18->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar3 ==
            (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pCVar25 = (CBlockIndex *)0x0;
        }
        else {
          pCVar25 = ppCVar3[-1];
        }
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        pCVar25 = CBlockIndex::GetAncestor
                            (pCVar25,(pCVar18->m_chain).vChain.
                                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1]->nHeight +
                                     iVar35);
        pCVar25->nTime = pCVar25->nTime + 0x200;
        iVar35 = iVar35 + -1;
      } while (iVar35 != -0xb);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pCVar25 = (CBlockIndex *)0x0;
      }
      else {
        pCVar25 = ppCVar3[-1];
      }
      local_760 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_758 = "";
      local_770 = &boost::unit_test::basic_cstring<char_const>::null;
      local_768 = &boost::unit_test::basic_cstring<char_const>::null;
      file_20.m_end = (iterator)0x1d1;
      file_20.m_begin = (iterator)&local_760;
      msg_20.m_end = pvVar34;
      msg_20.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_770,
                 msg_20);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      iVar35 = pCVar25->nHeight;
      pCVar19 = (CBlockIndex *)operator_new(0x98);
      memset(pCVar19,0,0x98);
      pCVar19->nHeight = iVar35 + 1;
      pCVar19->pprev = pCVar25;
      bVar13 = SequenceLocks((CTransaction *)local_188,1,
                             (vector<int,_std::allocator<int>_> *)local_1f8,pCVar19);
      local_1a8[0] = bVar13;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 1, active_chain_tip))"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_780 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_778 = "";
      iVar35 = 0;
      pvVar31 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_780,0x1d1);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      operator_delete(pCVar19,0x98);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      do {
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        ppCVar3 = (pCVar18->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar3 ==
            (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pCVar25 = (CBlockIndex *)0x0;
        }
        else {
          pCVar25 = ppCVar3[-1];
        }
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        local_188._0_8_ =
             CBlockIndex::GetAncestor
                       (pCVar25,(pCVar18->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight + iVar35);
        pcVar32 = 
        "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
        ;
        ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                             ((CBlockIndex **)local_188,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                              ,0x1d5,"TestBasicMining",
                              "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
                             );
        (*ppCVar22)->nTime = (*ppCVar22)->nTime - 0x200;
        iVar35 = iVar35 + -1;
      } while (iVar35 != -0xb);
      peVar2 = (txFirst->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start[2].
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
      uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
      uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar8;
      *(undefined8 *)
       ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = uVar6;
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar7;
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence = 0xfffffffe;
      *(int *)local_1f8._0_8_ = baseheight + 3;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      local_250.nLockTime =
           (pCVar18->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nHeight + 1;
      CMutableTransaction::GetHash((Txid *)local_188,&local_250);
      local_68 = (pointer)local_178;
      pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
      local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
      p_Stack_70 = (_Base_ptr)local_188._8_8_;
      tVar16 = NodeClock::now();
      sStack_290 = (long)tVar16.__d.__r / 1000000000;
      TestMemPoolEntryHelper::FromTx
                ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),
                 &local_250);
      CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree(local_148);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                   *)local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      local_790 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_788 = "";
      local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_798 = &boost::unit_test::basic_cstring<char_const>::null;
      file_21.m_end = (iterator)0x1e0;
      file_21.m_begin = (iterator)&local_790;
      msg_21.m_end = pvVar31;
      msg_21.m_begin = pcVar32;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_7a0,
                 msg_21);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1d8._0_8_ = (CBlockTemplate *)0x0;
      }
      else {
        local_1d8._0_8_ =
             ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
             (ppCVar3 + -1))->
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
        ;
      }
      ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                           ((CBlockIndex **)local_1d8,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                            ,0x1e0,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
      pCVar25 = *ppCVar22;
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = CheckFinalTxAtTip(pCVar25,(CTransaction *)local_188);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "!CheckFinalTxAtTip(*inline_assertion_check<true>(m_node.chainman->ActiveChain().Tip(), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp\", 480, __func__, \"m_node.chainman->ActiveChain().Tip()\"), CTransaction{tx})"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_7b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_7a8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      local_1a8[0] = !bVar13;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_7b0,0x1e0);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_7c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_7b8 = "";
      local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_22.m_end = (iterator)0x1e1;
      file_22.m_begin = (iterator)&local_7c0;
      msg_22.m_end = pvVar34;
      msg_22.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_7d0,
                 msg_22);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      local_1a8[0] = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_7e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_7d8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_7e0,0x1e1);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_7f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_7e8 = "";
      local_800 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_23.m_end = (iterator)0x1e2;
      file_23.m_begin = (iterator)&local_7f0;
      msg_23.m_end = pvVar34;
      msg_23.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_800,
                 msg_23);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar35 = (pCVar18->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]->nHeight;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      local_1a8[0] = IsFinalTx((CTransaction *)local_188,iVar35 + 2,iVar23);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast())"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_810 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_808 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_810,0x1e2);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      peVar2 = (txFirst->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start[3].
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = *(undefined8 *)&(peVar2->hash).m_wrapped;
      uVar7 = *(undefined8 *)((long)&peVar2->hash + 8);
      uVar8 = *(undefined8 *)((long)&peVar2->hash + 0x18);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = *(undefined8 *)((long)&peVar2->hash + 0x10);
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar8;
      *(undefined8 *)
       ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = uVar6;
      *(undefined8 *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar7;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      local_250.nLockTime = (uint32_t)iVar23;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_1f8,1);
      *(int *)local_1f8._0_8_ = baseheight + 4;
      CMutableTransaction::GetHash((Txid *)local_188,&local_250);
      local_68 = (pointer)local_178;
      pCStack_60 = (CTxMemPool *)auStack_170._0_8_;
      local_78._M_head_impl = (CBlockTemplate *)local_188._0_8_;
      p_Stack_70 = (_Base_ptr)local_188._8_8_;
      tVar16 = NodeClock::now();
      sStack_290 = (long)tVar16.__d.__r / 1000000000;
      TestMemPoolEntryHelper::FromTx
                ((CTxMemPoolEntry *)local_188,(TestMemPoolEntryHelper *)(local_2f0 + 0x58),
                 &local_250);
      CTxMemPool::addUnchecked(pCVar15,(CTxMemPoolEntry *)local_188);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree(local_148);
      std::
      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
      ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                   *)local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      local_820 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_818 = "";
      local_830 = &boost::unit_test::basic_cstring<char_const>::null;
      local_828 = &boost::unit_test::basic_cstring<char_const>::null;
      file_24.m_end = (iterator)0x1eb;
      file_24.m_begin = (iterator)&local_820;
      msg_24.m_end = pvVar34;
      msg_24.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_830,
                 msg_24);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1d8._0_8_ = (CBlockTemplate *)0x0;
      }
      else {
        local_1d8._0_8_ =
             ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
             (ppCVar3 + -1))->
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
        ;
      }
      ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                           ((CBlockIndex **)local_1d8,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                            ,0x1eb,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
      pCVar25 = *ppCVar22;
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = CheckFinalTxAtTip(pCVar25,(CTransaction *)local_188);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "!CheckFinalTxAtTip(*inline_assertion_check<true>(m_node.chainman->ActiveChain().Tip(), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp\", 491, __func__, \"m_node.chainman->ActiveChain().Tip()\"), CTransaction{tx})"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_840 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_838 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      local_1a8[0] = !bVar13;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_840,0x1eb);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_850 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_848 = "";
      local_860 = &boost::unit_test::basic_cstring<char_const>::null;
      local_858 = &boost::unit_test::basic_cstring<char_const>::null;
      file_25.m_end = (iterator)0x1ec;
      file_25.m_begin = (iterator)&local_850;
      msg_25.m_end = pvVar34;
      msg_25.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_860,
                 msg_25);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      local_1a8[0] = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_870 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_868 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_870,0x1ec);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_880 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_878 = "";
      local_890 = &boost::unit_test::basic_cstring<char_const>::null;
      local_888 = &boost::unit_test::basic_cstring<char_const>::null;
      file_26.m_end = (iterator)0x1ed;
      file_26.m_begin = (iterator)&local_880;
      msg_26.m_end = pvVar34;
      msg_26.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_890,
                 msg_26);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar35 = (pCVar18->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]->nHeight;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      local_1a8[0] = IsFinalTx((CTransaction *)local_188,iVar35 + 2,iVar23 + 1);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1)"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_8a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_898 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_8a0,0x1ed);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      *(pointer *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x10) = local_68;
      *(CTxMemPool **)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 0x18) = pCStack_60;
      *(CBlockTemplate **)
       ((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = local_78._M_head_impl;
      *(_Base_ptr *)
       (((local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = p_Stack_70;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      *(int *)local_1f8._0_8_ =
           (pCVar18->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nHeight + 1;
      local_250.nLockTime = 0;
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence = 0;
      local_8b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_8a8 = "";
      local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_27.m_end = (iterator)0x1f4;
      file_27.m_begin = (iterator)&local_8b0;
      msg_27.m_end = pvVar34;
      msg_27.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_8c0,
                 msg_27);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      ppCVar3 = (pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (pCVar18->m_chain).vChain.
          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1d8._0_8_ = (CBlockTemplate *)0x0;
      }
      else {
        local_1d8._0_8_ =
             ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
             (ppCVar3 + -1))->
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
        ;
      }
      ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                           ((CBlockIndex **)local_1d8,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                            ,500,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
      pCVar25 = *ppCVar22;
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      local_1a8[0] = CheckFinalTxAtTip(pCVar25,(CTransaction *)local_188);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ =
           "CheckFinalTxAtTip(*inline_assertion_check<true>(m_node.chainman->ActiveChain().Tip(), \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp\", 500, __func__, \"m_node.chainman->ActiveChain().Tip()\"), CTransaction{tx})"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_8d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_8c8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_8d0,500);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      local_8e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_8d8 = "";
      local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_28.m_end = (iterator)0x1f5;
      file_28.m_begin = (iterator)&local_8e0;
      msg_28.m_end = pvVar34;
      msg_28.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_8f0,
                 msg_28);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      local_1a8[0] = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_900 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_8f8 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_900,0x1f5);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence = 1;
      local_910 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_908 = (Chainstate *)0xea225f;
      local_920 = &boost::unit_test::basic_cstring<char_const>::null;
      local_918 = (CChainParams *)&boost::unit_test::basic_cstring<char_const>::null;
      file_29.m_end = (iterator)0x1f7;
      file_29.m_begin = (iterator)&local_910;
      msg_29.m_end = pvVar34;
      msg_29.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_920,
                 msg_29);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8[0] = !bVar13;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "!TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_930 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_928 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)&local_930,0x1f7);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence = 0x400000;
      local_998._88_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_938 = "";
      local_998._72_8_ = &boost::unit_test::basic_cstring<char_const>::null;
      local_998._80_8_ = &boost::unit_test::basic_cstring<char_const>::null;
      file_30.m_end = (iterator)0x1f9;
      file_30.m_begin = local_998 + 0x58;
      msg_30.m_end = pvVar34;
      msg_30.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                 (size_t)(local_998 + 0x48),msg_30);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      local_1a8[0] = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_998._56_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_998._64_8_ = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)(local_998 + 0x38),0x1f9);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      (local_250.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->nSequence = 0x400001;
      local_998._40_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_998._48_8_ = "";
      local_998._24_8_ = &boost::unit_test::basic_cstring<char_const>::null;
      local_998._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
      file_31.m_end = (iterator)0x1fb;
      file_31.m_begin = local_998 + 0x28;
      msg_31.m_end = pvVar34;
      msg_31.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                 (size_t)(local_998 + 0x18),msg_31);
      CTransaction::CTransaction((CTransaction *)local_188,&local_250);
      bVar13 = TestSequenceLocks(this,(CTransaction *)local_188,pCVar15);
      local_1a8[0] = !bVar13;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "!TestSequenceLocks(CTransaction{tx}, tx_mempool)";
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_998._8_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_998._16_8_ = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,_cVar36,
                 (size_t)(local_998 + 8),0x1fb);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_170);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_188);
      AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
      ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_998,(CScript *)local_188);
      std::
      _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)(auStack_170 + 0x10));
      if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_188,
                   (CBlockTemplate *)local_188._0_8_);
      }
      local_9a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_9a0 = "";
      local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_32.m_end = (iterator)0x1fe;
      file_32.m_begin = (iterator)&local_9a8;
      msg_32.m_end = pvVar34;
      msg_32.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_9b8,
                 msg_32);
      local_58[0] = (CBlockTemplate *)local_998._0_8_ != (CBlockTemplate *)0x0;
      local_58._8_8_ = (element_type *)0x0;
      sStack_48.pi_ = (sp_counted_base *)0x0;
      local_1a8._0_8_ = "pblocktemplate";
      local_1a8._8_4_ = 2.150269e-38;
      local_1a8._12_4_ = 0;
      local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
      local_188._0_8_ = &PTR__lazy_ostream_013abc70;
      local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_9c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_9c0 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      auStack_170._0_8_ = (CTxMemPool *)local_1a8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,(lazy_ostream *)local_188,1,0,WARN,_cVar36,
                 (size_t)&local_9c8,0x1fe);
      boost::detail::shared_count::~shared_count(&sStack_48);
      local_9f0._M_right = (_Base_ptr)0xea21fb;
      local_9d0 = "";
      local_9f0._M_parent = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
      local_9f0._M_left = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
      file_33.m_end = (iterator)0x204;
      file_33.m_begin = (iterator)&local_9f0._M_right;
      msg_33.m_end = pvVar34;
      msg_33.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                 (size_t)&local_9f0._M_parent,msg_33);
      iVar35 = 0;
      local_1a8._8_4_ = local_1a8._8_4_ & 0xffffff00;
      local_1a8._0_8_ = &PTR__lazy_ostream_013abb30;
      local_1a8._16_4_ = 0x13c0138;
      local_1a8._20_4_ = 0;
      local_1a8._24_4_ = 0xf6cf21;
      sStack_18c = 0;
      lVar26 = (long)*(pointer *)(local_998._0_8_ + 0x58) -
               (long)(((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)(local_998._0_8_ + 0x50))->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      local_9f0._0_8_ = lVar26 >> 4;
      local_210 = &local_9f0;
      local_218 = &local_9f4;
      local_1c8[0] = lVar26 == 0x30;
      local_9f4 = 3;
      local_1c8._8_8_ = (element_type *)0x0;
      local_1c8._16_8_ = (_Base_ptr)0x0;
      local_1d8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_1d8._8_8_ = "";
      auStack_170._0_8_ = &local_210;
      local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
      local_188._0_8_ = &PTR__lazy_ostream_013abb70;
      local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)&local_218;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      pcVar32 = "pblocktemplate->block.vtx.size()";
      pvVar31 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1c8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xea2260,
                 (size_t)local_1d8,0x204,(lazy_ostream *)local_188,"3U",(assertion_result *)local_58
                );
      boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
      do {
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        ppCVar3 = (pCVar18->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar3 ==
            (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pCVar25 = (CBlockIndex *)0x0;
        }
        else {
          pCVar25 = ppCVar3[-1];
        }
        pCVar18 = ChainstateManager::ActiveChainstate
                            ((this->super_TestingSetup).super_ChainTestingSetup.
                             super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
        local_188._0_8_ =
             CBlockIndex::GetAncestor
                       (pCVar25,(pCVar18->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight + iVar35);
        pcVar33 = 
        "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
        ;
        ppCVar22 = inline_assertion_check<true,CBlockIndex*>
                             ((CBlockIndex **)local_188,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                              ,0x207,"TestBasicMining",
                              "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
                             );
        (*ppCVar22)->nTime = (*ppCVar22)->nTime + 0x200;
        iVar35 = iVar35 + -1;
      } while (iVar35 != -0xb);
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      piVar1 = &(pCVar18->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->nHeight;
      *piVar1 = *piVar1 + 1;
      pCVar18 = ChainstateManager::ActiveChainstate
                          ((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.chainman._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      iVar23 = CBlockIndex::GetMedianTimePast
                         ((pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]);
      SetMockTime(iVar23 + 1);
      local_a08 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_a00 = "";
      local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
      local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
      file_34.m_end = (iterator)0x20d;
      file_34.m_begin = (iterator)&local_a08;
      msg_34.m_end = pvVar31;
      msg_34.m_begin = pcVar33;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_a18,
                 msg_34);
      AssemblerForTest((BlockAssembler *)local_188,this,pCVar15);
      ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1d8,(CScript *)local_188);
      uVar7 = local_1d8._0_8_;
      uVar6 = local_998._0_8_;
      local_1d8._0_8_ = (CBlockTemplate *)0x0;
      local_998._0_8_ = uVar7;
      if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)uVar6
          != (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0)
      {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_998,(CBlockTemplate *)uVar6);
      }
      local_1a8[0] = (_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_998._0_8_ !=
                     (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0;
      local_1a8._16_4_ = 0;
      local_1a8._20_4_ = 0;
      local_1c8._0_8_ = "pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)"
      ;
      local_1c8._8_8_ = "";
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abc70;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)local_1c8;
      local_a28 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_a20 = "";
      pvVar31 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar32
                 ,(size_t)&local_a28,0x20d);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      if ((CBlockTemplate *)local_1d8._0_8_ != (CBlockTemplate *)0x0) {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_1d8,
                   (CBlockTemplate *)local_1d8._0_8_);
      }
      local_1d8._0_8_ = (CBlockTemplate *)0x0;
      std::
      _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)(auStack_170 + 0x10));
      if ((CBlockTemplate *)local_188._0_8_ != (CBlockTemplate *)0x0) {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_188,
                   (CBlockTemplate *)local_188._0_8_);
      }
      local_a38 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_a30 = "";
      local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
      local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
      file_35.m_end = (iterator)0x20e;
      file_35.m_begin = (iterator)&local_a38;
      msg_35.m_end = pvVar34;
      msg_35.m_begin = pvVar31;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_a48,
                 msg_35);
      local_1a8._8_4_ = local_1a8._8_4_ & 0xffffff00;
      local_1a8._0_8_ = &PTR__lazy_ostream_013abb30;
      local_1a8._16_4_ = 0x13c0138;
      local_1a8._20_4_ = 0;
      local_1a8._24_4_ = 0xf6cf21;
      sStack_18c = 0;
      lVar26 = (long)*(pointer *)(local_998._0_8_ + 0x58) -
               (long)(((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)(local_998._0_8_ + 0x50))->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      local_9f0._0_8_ = lVar26 >> 4;
      local_1c8[0] = lVar26 == 0x50;
      local_9f4 = 5;
      local_1c8._8_8_ = (element_type *)0x0;
      local_1c8._16_8_ = (_Base_ptr)0x0;
      local_1d8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_1d8._8_8_ = "";
      local_210 = &local_9f0;
      local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
      local_188._0_8_ = &PTR__lazy_ostream_013abb70;
      local_178 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      auStack_170._0_8_ = &local_210;
      local_218 = &local_9f4;
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013abbb0;
      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_40 = (_Base_ptr)&local_218;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1c8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xea2260,
                 (size_t)local_1d8,0x20e,(CScript *)local_188,"5U",(lazy_ostream *)local_58);
      boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
      if ((CBlockTemplate *)local_998._0_8_ != (CBlockTemplate *)0x0) {
        std::default_delete<node::CBlockTemplate>::operator()
                  ((default_delete<node::CBlockTemplate> *)local_998,
                   (CBlockTemplate *)local_998._0_8_);
      }
      if ((CBlockTemplate *)local_1f8._0_8_ != (CBlockTemplate *)0x0) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ - local_1f8._0_8_);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_208);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_250.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_250.vin);
      if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar18->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar5 ==
        (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar25 = (CBlockIndex *)0x0;
    }
    else {
      pCVar25 = ppCVar5[-1];
    }
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pcVar32 = "del->pprev";
    ppCVar22 = inline_assertion_check<true,CBlockIndex*&>
                         (&pCVar25->pprev,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miner_tests.cpp"
                          ,0x19c,"TestBasicMining","del->pprev");
    CChain::SetTip(&pCVar18->m_chain,*ppCVar22);
    pCVar18 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar21 = Chainstate::CoinsTip(pCVar18);
    puVar20 = pCVar25->pprev->phashBlock;
    if (puVar20 == (uint256 *)0x0) break;
    local_188._0_8_ = *(undefined8 *)(puVar20->super_base_blob<256U>).m_data._M_elems;
    local_188._8_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 8);
    local_178 = *(undefined1 (*) [8])((puVar20->super_base_blob<256U>).m_data._M_elems + 0x10);
    auStack_170._0_8_ = *(undefined8 *)((puVar20->super_base_blob<256U>).m_data._M_elems + 0x18);
    CCoinsViewCache::SetBestBlock(pCVar21,(uint256 *)local_188);
    if (pCVar25->phashBlock != (uint256 *)0x0) {
      operator_delete(pCVar25->phashBlock,0x20);
    }
    operator_delete(pCVar25,0x98);
  }
LAB_004536e8:
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

void MinerTestingSetup::TestBasicMining(const CScript& scriptPubKey, const std::vector<CTransactionRef>& txFirst, int baseheight)
{
    Txid hash;
    CMutableTransaction tx;
    TestMemPoolEntryHelper entry;
    entry.nFee = 11;
    entry.nHeight = 11;

    const CAmount BLOCKSUBSIDY = 50 * COIN;
    const CAmount LOWFEE = CENT;
    const CAmount HIGHFEE = COIN;
    const CAmount HIGHERFEE = 4 * COIN;

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // Just to make sure we can still make simple blocks
        auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
        BOOST_CHECK(pblocktemplate);

        // block sigops > limit: 1000 CHECKMULTISIG + 1
        tx.vin.resize(1);
        // NOTE: OP_NOP is used to force 20 SigOps for the CHECKMULTISIG
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_0 << OP_0 << OP_NOP << OP_CHECKMULTISIG << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vout.resize(1);
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we don't set the # of sig ops in the CTxMemPoolEntry, template creation fails
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }

        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-blk-sigops"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we do set the # of sig ops in the CTxMemPoolEntry, template creation passes
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).SigOpsCost(80).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // block size > limit
        tx.vin[0].scriptSig = CScript();
        // 18 * (520char + DROP) + OP_1 = 9433 bytes
        std::vector<unsigned char> vchData(520);
        for (unsigned int i = 0; i < 18; ++i) {
            tx.vin[0].scriptSig << vchData << OP_DROP;
        }
        tx.vin[0].scriptSig << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 128; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // orphan in tx_mempool, template creation fails
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // child with higher feerate than parent
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vin[0].prevout.hash = txFirst[1]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin.resize(2);
        tx.vin[1].scriptSig = CScript() << OP_1;
        tx.vin[1].prevout.hash = txFirst[0]->GetHash();
        tx.vin[1].prevout.n = 0;
        tx.vout[0].nValue = tx.vout[0].nValue + BLOCKSUBSIDY - HIGHERFEE; // First txn output + fresh coinbase - new txn fee
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHERFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // coinbase in tx_mempool, template creation fails
        tx.vin.resize(1);
        tx.vin[0].prevout.SetNull();
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_1;
        tx.vout[0].nValue = 0;
        hash = tx.GetHash();
        // give it a fee so it'll get mined
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw bad-cb-multiple
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-cb-multiple"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // double spend txn pair in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        tx.vout[0].scriptPubKey = CScript() << OP_1;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vout[0].scriptPubKey = CScript() << OP_2;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // subsidy changing
        int nHeight = m_node.chainman->ActiveChain().Height();
        // Create an actual 209999-long block chain (without valid blocks).
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 209999) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
        // Extend to a 210000-long block chain.
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 210000) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));

        // invalid p2sh txn in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - LOWFEE;
        CScript script = CScript() << OP_0;
        tx.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(script));
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin[0].scriptSig = CScript() << std::vector<unsigned char>(script.begin(), script.end());
        tx.vout[0].nValue -= LOWFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw block-validation-failed
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("block-validation-failed"));

        // Delete the dummy blocks again.
        while (m_node.chainman->ActiveChain().Tip()->nHeight > nHeight) {
            CBlockIndex* del = m_node.chainman->ActiveChain().Tip();
            m_node.chainman->ActiveChain().SetTip(*Assert(del->pprev));
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(del->pprev->GetBlockHash());
            delete del->phashBlock;
            delete del;
        }
    }

    CTxMemPool& tx_mempool{MakeMempool()};
    LOCK(tx_mempool.cs);

    // non-final txs in mempool
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);
    const int flags{LOCKTIME_VERIFY_SEQUENCE};
    // height map
    std::vector<int> prevheights;

    // relative height locked
    tx.version = 2;
    tx.vin.resize(1);
    prevheights.resize(1);
    tx.vin[0].prevout.hash = txFirst[0]->GetHash(); // only 1 transaction
    tx.vin[0].prevout.n = 0;
    tx.vin[0].scriptSig = CScript() << OP_1;
    tx.vin[0].nSequence = m_node.chainman->ActiveChain().Tip()->nHeight + 1; // txFirst[0] is the 2nd block
    prevheights[0] = baseheight + 1;
    tx.vout.resize(1);
    tx.vout[0].nValue = BLOCKSUBSIDY-HIGHFEE;
    tx.vout[0].scriptPubKey = CScript() << OP_1;
    tx.nLockTime = 0;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 2, active_chain_tip))); // Sequence locks pass on 2nd block
    }

    // relative time locked
    tx.vin[0].prevout.hash = txFirst[1]->GetHash();
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | (((m_node.chainman->ActiveChain().Tip()->GetMedianTimePast()+1-m_node.chainman->ActiveChain()[1]->GetMedianTimePast()) >> CTxIn::SEQUENCE_LOCKTIME_GRANULARITY) + 1); // txFirst[1] is the 3rd block
    prevheights[0] = baseheight + 2;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    const int SEQUENCE_LOCK_TIME = 512; // Sequence locks pass 512 seconds later
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i)
        m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 1, active_chain_tip)));
    }

    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime -= SEQUENCE_LOCK_TIME; // undo tricked MTP
    }

    // absolute height locked
    tx.vin[0].prevout.hash = txFirst[2]->GetHash();
    tx.vin[0].nSequence = CTxIn::MAX_SEQUENCE_NONFINAL;
    prevheights[0] = baseheight + 3;
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast())); // Locktime passes on 2nd block

    // absolute time locked
    tx.vin[0].prevout.hash = txFirst[3]->GetHash();
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->GetMedianTimePast();
    prevheights.resize(1);
    prevheights[0] = baseheight + 4;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1)); // Locktime passes 1 second later

    // mempool-dependent transactions (not added)
    tx.vin[0].prevout.hash = hash;
    prevheights[0] = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    tx.nLockTime = 0;
    tx.vin[0].nSequence = 0;
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG;
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
    BOOST_CHECK(pblocktemplate);

    // None of the of the absolute height/time locked tx should have made
    // it into the template because we still check IsFinalTx in CreateNewBlock,
    // but relative locked txs will if inconsistently added to mempool.
    // For now these will still generate a valid template until BIP68 soft fork
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 3U);
    // However if we advance height by 1 and time by SEQUENCE_LOCK_TIME, all of them should be mined
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    }
    m_node.chainman->ActiveChain().Tip()->nHeight++;
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);

    BOOST_CHECK(pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 5U);
}